

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O3

void __thiscall Nes_Vrc6_Apu::Nes_Vrc6_Apu(Nes_Vrc6_Apu *this)

{
  uint8_t *puVar1;
  long lVar2;
  
  Blip_Synth_::Blip_Synth_(&(this->saw_synth).impl,(this->saw_synth).impulses,8);
  Blip_Synth_::Blip_Synth_(&(this->square_synth).impl,(this->square_synth).impulses,0xc);
  this->oscs[0].output = (Blip_Buffer *)0x0;
  this->oscs[1].output = (Blip_Buffer *)0x0;
  this->oscs[2].output = (Blip_Buffer *)0x0;
  Blip_Synth_::volume_unit(&(this->saw_synth).impl,0.006238709677419354);
  Blip_Synth_::volume_unit(&(this->square_synth).impl,0.0064466666666666665);
  this->last_time = 0;
  lVar2 = 0x10;
  do {
    this->oscs[0].regs[lVar2 + -0xe] = '\0';
    puVar1 = this->oscs[0].regs + lVar2 + -0x10;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1 = this->oscs[0].regs + lVar2;
    *(undefined8 *)puVar1 = 0;
    *(Blip_Buffer **)(puVar1 + 8) = (Blip_Buffer *)0x1;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x70);
  return;
}

Assistant:

Nes_Vrc6_Apu::Nes_Vrc6_Apu()
{
	output( NULL );
	volume( 1.0 );
	reset();
}